

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int block_cipher_df(uchar *output,uchar *data,size_t data_len)

{
  uchar uVar1;
  int in_EAX;
  int extraout_EAX;
  uchar *puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  uchar chain [16];
  uchar key [32];
  uchar tmp [48];
  uchar buf [416];
  mbedtls_aes_context aes_ctx;
  
  if (data_len < 0x181) {
    memset(buf,0,0x1a0);
    mbedtls_aes_init(&aes_ctx);
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = (uchar)(data_len >> 8);
    buf[0x13] = (uchar)data_len;
    buf[0x17] = '0';
    memcpy(buf + 0x18,data,data_len);
    buf[data_len + 0x18] = 0x80;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      key[lVar3] = (uchar)lVar3;
    }
    mbedtls_aes_setkey_enc(&aes_ctx,key,0x100);
    for (uVar5 = 0; uVar1 = buf[3], uVar5 < 0x30; uVar5 = uVar5 + 0x10) {
      chain[0] = '\0';
      chain[1] = '\0';
      chain[2] = '\0';
      chain[3] = '\0';
      chain[4] = '\0';
      chain[5] = '\0';
      chain[6] = '\0';
      chain[7] = '\0';
      chain[8] = '\0';
      chain[9] = '\0';
      chain[10] = '\0';
      chain[0xb] = '\0';
      chain[0xc] = '\0';
      chain[0xd] = '\0';
      chain[0xe] = '\0';
      chain[0xf] = '\0';
      puVar2 = buf;
      uVar4 = data_len + 0x19;
      while (uVar4 != 0) {
        for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
          chain[lVar3] = chain[lVar3] ^ puVar2[lVar3];
        }
        puVar2 = puVar2 + 0x10;
        bVar6 = uVar4 < 0x10;
        uVar4 = uVar4 - 0x10;
        if (bVar6) {
          uVar4 = 0;
        }
        mbedtls_aes_crypt_ecb(&aes_ctx,1,chain,chain);
      }
      *(undefined8 *)(tmp + uVar5) = chain._0_8_;
      *(undefined8 *)(tmp + uVar5 + 8) = chain._8_8_;
      buf[3] = uVar1 + '\x01';
    }
    mbedtls_aes_setkey_enc(&aes_ctx,tmp,0x100);
    for (lVar3 = 0; (uint)lVar3 < 0x30; lVar3 = lVar3 + 0x10) {
      mbedtls_aes_crypt_ecb(&aes_ctx,1,tmp + 0x20,tmp + 0x20);
      *(undefined8 *)(output + lVar3) = tmp._32_8_;
      *(undefined8 *)(output + lVar3 + 8) = tmp._40_8_;
    }
    mbedtls_aes_free(&aes_ctx);
    in_EAX = extraout_EAX;
  }
  return in_EAX;
}

Assistant:

static int block_cipher_df( unsigned char *output,
                            const unsigned char *data, size_t data_len )
{
    unsigned char buf[MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16];
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char key[MBEDTLS_CTR_DRBG_KEYSIZE];
    unsigned char chain[MBEDTLS_CTR_DRBG_BLOCKSIZE];
    unsigned char *p, *iv;
    mbedtls_aes_context aes_ctx;

    int i, j;
    size_t buf_len, use_len;

    if( data_len > MBEDTLS_CTR_DRBG_MAX_SEED_INPUT )
        return( MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG );

    memset( buf, 0, MBEDTLS_CTR_DRBG_MAX_SEED_INPUT + MBEDTLS_CTR_DRBG_BLOCKSIZE + 16 );
    mbedtls_aes_init( &aes_ctx );

    /*
     * Construct IV (16 bytes) and S in buffer
     * IV = Counter (in 32-bits) padded to 16 with zeroes
     * S = Length input string (in 32-bits) || Length of output (in 32-bits) ||
     *     data || 0x80
     *     (Total is padded to a multiple of 16-bytes with zeroes)
     */
    p = buf + MBEDTLS_CTR_DRBG_BLOCKSIZE;
    *p++ = ( data_len >> 24 ) & 0xff;
    *p++ = ( data_len >> 16 ) & 0xff;
    *p++ = ( data_len >> 8  ) & 0xff;
    *p++ = ( data_len       ) & 0xff;
    p += 3;
    *p++ = MBEDTLS_CTR_DRBG_SEEDLEN;
    memcpy( p, data, data_len );
    p[data_len] = 0x80;

    buf_len = MBEDTLS_CTR_DRBG_BLOCKSIZE + 8 + data_len + 1;

    for( i = 0; i < MBEDTLS_CTR_DRBG_KEYSIZE; i++ )
        key[i] = i;

    mbedtls_aes_setkey_enc( &aes_ctx, key, MBEDTLS_CTR_DRBG_KEYBITS );

    /*
     * Reduce data to MBEDTLS_CTR_DRBG_SEEDLEN bytes of data
     */
    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        p = buf;
        memset( chain, 0, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        use_len = buf_len;

        while( use_len > 0 )
        {
            for( i = 0; i < MBEDTLS_CTR_DRBG_BLOCKSIZE; i++ )
                chain[i] ^= p[i];
            p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
            use_len -= ( use_len >= MBEDTLS_CTR_DRBG_BLOCKSIZE ) ?
                       MBEDTLS_CTR_DRBG_BLOCKSIZE : use_len;

            mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, chain, chain );
        }

        memcpy( tmp + j, chain, MBEDTLS_CTR_DRBG_BLOCKSIZE );

        /*
         * Update IV
         */
        buf[3]++;
    }

    /*
     * Do final encryption with reduced data
     */
    mbedtls_aes_setkey_enc( &aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS );
    iv = tmp + MBEDTLS_CTR_DRBG_KEYSIZE;
    p = output;

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        mbedtls_aes_crypt_ecb( &aes_ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
        memcpy( p, iv, MBEDTLS_CTR_DRBG_BLOCKSIZE );
        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    mbedtls_aes_free( &aes_ctx );

    return( 0 );
}